

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_int.c
# Opt level: O1

int mpt_cint(int *val,char *src,int base,int *range)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  int tmp;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = _mpt_convert_int(&local_14,4,src,base);
  iVar2 = iVar1;
  if ((0 < iVar1) &&
     (((range == (int *)0x0 || ((iVar2 = -2, *range <= local_14 && (local_14 <= range[1])))) &&
      (iVar2 = iVar1, val != (int *)0x0)))) {
    *val = local_14;
  }
  return iVar2;
}

Assistant:

extern int _mpt_convert_int(void *val, size_t vlen, const char *src, int base)
{
	intmax_t tmp;
	char *end;
	
	if (!(end = (char *) src)) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	/* max size unsigend integer */
	tmp = strtoimax(src, &end, base);
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	switch (vlen) {
	  case sizeof(int8_t) :
		if (tmp < INT8_MIN || tmp > INT8_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int8_t *) val) = tmp;
		break;
	  case sizeof(int16_t):
		if (tmp < INT16_MIN || tmp > INT16_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int16_t *) val) = tmp;
		break;
	  case sizeof(int32_t):
		if (tmp < INT32_MIN || tmp > INT32_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int32_t *) val) = tmp;
		break;
	  case sizeof(int64_t):
		if (tmp < INT64_MIN || tmp > INT64_MAX) {
			return MPT_ERROR(BadValue);
		}
		if (val) *((int64_t *) val) = tmp;
		break;
	  default:
		return MPT_ERROR(BadType);
	}
	
	return end - src;
}